

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O3

void __thiscall
btMultiBody::stepPositionsMultiDof::anon_struct_1_0_00000001::operator()
          (anon_struct_1_0_00000001 *this,btVector3 *omega,btQuaternion *quat,bool baseBody,
          btScalar dt)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_28;
  
  if ((int)quat == 0) {
    fVar8 = omega->m_floats[3];
    fVar2 = *(float *)(this + 8);
    fVar9 = omega->m_floats[0];
    fVar7 = (float)*(undefined8 *)(omega->m_floats + 1);
    fVar13 = (float)((ulong)*(undefined8 *)(omega->m_floats + 1) >> 0x20);
    fVar10 = (float)*(undefined8 *)this;
    fVar11 = (float)((ulong)*(undefined8 *)this >> 0x20);
    fVar4 = (fVar8 * fVar11 + fVar13 * fVar10) - fVar9 * fVar2;
    fVar5 = (fVar2 * fVar8 + fVar9 * (float)*(undefined8 *)(this + 4)) - fVar7 * fVar10;
    fVar6 = (fVar10 * fVar8 + fVar7 * (float)((ulong)*(undefined8 *)(this + 4) >> 0x20)) -
            fVar13 * fVar11;
    fVar3 = -fVar7;
    fVar12 = -fVar13;
    fVar2 = fVar2 * fVar12 + (fVar11 * fVar3 - fVar10 * fVar9);
    fVar11 = fVar7 * fVar5 + fVar12 * fVar4 + -fVar9 * fVar2 + fVar6 * fVar8;
    fVar10 = fVar13 * fVar6 + -fVar9 * fVar5 + fVar3 * fVar2 + fVar4 * fVar8;
    fVar8 = fVar4 * fVar9 + fVar6 * fVar3 + fVar2 * fVar12 + fVar5 * fVar8;
  }
  else {
    fVar11 = (float)*(undefined8 *)this;
    fVar10 = (float)((ulong)*(undefined8 *)this >> 0x20);
    fVar8 = (float)*(undefined8 *)(this + 8);
  }
  fVar2 = SQRT(fVar8 * fVar8 + fVar11 * fVar11 + fVar10 * fVar10);
  uVar1 = -(uint)(0.7853982 < fVar2 * dt);
  fVar2 = (float)(~uVar1 & (uint)fVar2 | (uint)(0.7853982 / dt) & uVar1);
  if (0.001 <= fVar2) {
    fVar9 = sinf(fVar2 * 0.5 * dt);
    fVar9 = fVar9 / fVar2;
  }
  else {
    fVar9 = dt * 0.5 + dt * dt * dt * -0.020833334 * fVar2 * fVar2;
  }
  fVar11 = fVar11 * fVar9;
  fVar10 = fVar9 * fVar10;
  fVar9 = fVar9 * fVar8;
  if ((char)quat == '\0') {
    fVar5 = cosf(dt * fVar2 * 0.5);
    fVar8 = omega->m_floats[0];
    fVar2 = omega->m_floats[1];
    fVar3 = omega->m_floats[2];
    fVar12 = omega->m_floats[3];
    fVar4 = fVar8 * -fVar10 + fVar2 * fVar11 + fVar5 * fVar3 + fVar9 * fVar12;
    fVar6 = fVar2 * -fVar9 + fVar3 * fVar10 + fVar5 * fVar8 + fVar11 * fVar12;
    fVar7 = fVar3 * -fVar11 + fVar8 * fVar9 + fVar5 * fVar2 + fVar10 * fVar12;
    fVar8 = fVar3 * -fVar9 + fVar2 * -fVar10 + fVar5 * fVar12 + -fVar11 * fVar8;
  }
  else {
    local_28 = -fVar10;
    fVar3 = cosf(dt * fVar2 * 0.5);
    fVar2 = omega->m_floats[3];
    fVar12 = (float)*(undefined8 *)(omega->m_floats + 1);
    fVar5 = (float)((ulong)*(undefined8 *)(omega->m_floats + 1) >> 0x20);
    fVar8 = omega->m_floats[0];
    fVar4 = fVar11 * fVar12 + local_28 * fVar8 + -fVar9 * fVar2 + fVar5 * fVar3;
    fVar6 = fVar10 * fVar5 + -fVar9 * fVar12 + -fVar11 * fVar2 + fVar8 * fVar3;
    fVar7 = fVar9 * fVar8 + -fVar11 * fVar5 + local_28 * fVar2 + fVar12 * fVar3;
    fVar8 = fVar9 * fVar5 + fVar10 * fVar12 + fVar3 * fVar2 + fVar8 * fVar11;
  }
  fVar2 = 1.0 / SQRT(fVar8 * fVar8 + fVar4 * fVar4 + fVar6 * fVar6 + fVar7 * fVar7);
  omega->m_floats[0] = fVar6 * fVar2;
  omega->m_floats[1] = fVar7 * fVar2;
  omega->m_floats[2] = fVar4 * fVar2;
  omega->m_floats[3] = fVar8 * fVar2;
  return;
}

Assistant:

void operator() (const btVector3 &omega, btQuaternion &quat, bool baseBody, btScalar dt)
		{
			//baseBody	=>	quat is alias and omega is global coor
			//!baseBody	=>	quat is alibi and omega is local coor	
			
			btVector3 axis;
			btVector3 angvel;

			if(!baseBody)			
				angvel = quatRotate(quat, omega);				//if quat is not m_baseQuat, it is alibi => ok			
			else
				angvel = omega;
		
			btScalar fAngle = angvel.length(); 		
			//limit the angular motion
			if (fAngle * dt > ANGULAR_MOTION_THRESHOLD)
			{
				fAngle = btScalar(0.5)*SIMD_HALF_PI / dt;
			}

			if ( fAngle < btScalar(0.001) )
			{
				// use Taylor's expansions of sync function
				axis   = angvel*( btScalar(0.5)*dt-(dt*dt*dt)*(btScalar(0.020833333333))*fAngle*fAngle );
			}
			else
			{
				// sync(fAngle) = sin(c*fAngle)/t
				axis   = angvel*( btSin(btScalar(0.5)*fAngle*dt)/fAngle );
			}
			
			if(!baseBody)				
				quat = btQuaternion(axis.x(),axis.y(),axis.z(),btCos( fAngle*dt*btScalar(0.5) )) * quat;			
			else			
				quat = quat * btQuaternion(-axis.x(),-axis.y(),-axis.z(),btCos( fAngle*dt*btScalar(0.5) ));
				//equivalent to: quat = (btQuaternion(axis.x(),axis.y(),axis.z(),btCos( fAngle*dt*btScalar(0.5) )) * quat.inverse()).inverse();			
		
			quat.normalize();
		}